

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_strcasecmp(char *s1,char *s2)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  byte *local_30;
  uchar *us2;
  uchar *us1;
  char *s2_local;
  char *s1_local;
  
  local_30 = (byte *)s2;
  us2 = (uchar *)s1;
  do {
    iVar2 = tolower((uint)*us2);
    iVar3 = tolower((uint)*local_30);
    if (iVar2 != iVar3) {
      iVar2 = tolower((uint)*us2);
      iVar3 = tolower((uint)*local_30);
      return iVar2 - iVar3;
    }
    uVar1 = *us2;
    local_30 = local_30 + 1;
    us2 = us2 + 1;
  } while (uVar1 != '\0');
  return 0;
}

Assistant:

static int arg_strcasecmp(const char * s1, const char * s2) {
	const unsigned char * us1 = (const unsigned char *)s1;
	const unsigned char * us2 = (const unsigned char *)s2;

	while (tolower(*us1) == tolower(*us2++))
		if (*us1++ == '\0') {
			return 0;
		}

	return tolower(*us1) - tolower(*--us2);
}